

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall position::setup(position *this,istringstream *fen)

{
  bool bVar1;
  int iVar2;
  U64 UVar3;
  mapped_type *pmVar4;
  reference pvVar5;
  U64 local_190;
  U16 local_16c;
  U8 local_154;
  Color local_e4;
  Color local_e0;
  Color local_dc;
  ushort local_d6;
  Color stm;
  U8 local_cd;
  Square local_cc;
  U8 local_c5;
  Square local_c4;
  reference local_c0;
  char *c_2;
  iterator __end1_2;
  iterator __begin1_2;
  string *__range1_2;
  int local_98;
  Col col;
  Row row;
  U16 cr;
  char *c_1;
  iterator __end1_1;
  iterator __begin1_1;
  string *__range1_1;
  char *local_68;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  Square s;
  undefined1 local_38 [8];
  string token;
  istringstream *fen_local;
  position *this_local;
  
  token.field_2._8_8_ = fen;
  clear(this);
  std::__cxx11::string::string((string *)local_38);
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  __range1._0_4_ = 0x38;
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38)
  ;
  c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_68 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    iVar2 = isdigit((int)*local_68);
    if (iVar2 == 0) {
      if (*local_68 == '/') {
        __range1_1._0_4_ = 0x10;
        operator-=((Square *)&__range1,(int *)&__range1_1);
      }
      else {
        set_piece(this,local_68,(Square *)&__range1);
        ::operator++((Square *)&__range1);
      }
    }
    else {
      __range1_1._4_4_ = *local_68 + -0x30;
      operator+=((Square *)&__range1,(int *)((long)&__range1_1 + 4));
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"w");
  (this->ifo).stm = (byte)~bVar1 & black;
  UVar3 = zobrist::stm(&(this->ifo).stm);
  (this->ifo).key = (this->ifo).key ^ UVar3;
  UVar3 = zobrist::stm(&(this->ifo).stm);
  (this->ifo).repkey = (this->ifo).repkey ^ UVar3;
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  (this->ifo).cmask = 0;
  __end1_1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  c_1 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1_1,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&c_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    _row = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end1_1);
    pmVar4 = std::
             map<char,_unsigned_short,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_short>_>_>
             ::at(&CastleRights,_row);
    col._2_2_ = *pmVar4;
    (this->ifo).cmask = (this->ifo).cmask | col._2_2_;
    UVar3 = zobrist::castle(&(this->ifo).stm,(U16 *)((long)&col + 2));
    (this->ifo).key = (this->ifo).key ^ UVar3;
    UVar3 = zobrist::castle(&(this->ifo).stm,(U16 *)((long)&col + 2));
    (this->ifo).repkey = UVar3 ^ (this->ifo).repkey;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  (this->ifo).eps = no_square;
  local_98 = 9;
  __range1_2._4_4_ = 9;
  __end1_2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  c_2 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1_2,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&c_2), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_c0 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1_2);
    if (('`' < *local_c0) && (*local_c0 < 'i')) {
      __range1_2._4_4_ = *local_c0 + -0x61;
    }
    if ((*local_c0 == '3') || (*local_c0 == '6')) {
      local_98 = *local_c0 + -0x31;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  (this->ifo).eps = __range1_2._4_4_ + local_98 * 8;
  local_c4 = (this->ifo).eps;
  bVar1 = util::on_board((int *)&local_c4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (this->ifo).eps = no_square;
  }
  if ((this->ifo).eps != no_square) {
    local_cc = (this->ifo).eps;
    iVar2 = util::col((int *)&local_cc);
    local_c5 = (U8)iVar2;
    UVar3 = zobrist::ep(&local_c5);
    (this->ifo).key = (this->ifo).key ^ UVar3;
    stm = (this->ifo).eps;
    iVar2 = util::col((int *)&stm);
    local_cd = (U8)iVar2;
    UVar3 = zobrist::ep(&local_cd);
    (this->ifo).repkey = UVar3 ^ (this->ifo).repkey;
  }
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"-");
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_154 = '\0';
  }
  else {
    iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
    local_154 = (U8)iVar2;
  }
  (this->ifo).move50 = local_154;
  local_d6 = (ushort)(this->ifo).move50;
  UVar3 = zobrist::mv50(&local_d6);
  (this->ifo).key = (this->ifo).key ^ UVar3;
  std::operator>>((istream *)token.field_2._8_8_,(string *)local_38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"-");
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_16c = 0;
  }
  else {
    iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
    local_16c = (U16)iVar2;
  }
  (this->ifo).hmvs = local_16c;
  UVar3 = zobrist::hmvs(&(this->ifo).hmvs);
  (this->ifo).key = (this->ifo).key ^ UVar3;
  local_dc = to_move(this);
  pvVar5 = std::array<Square,_2UL>::operator[](&(this->pcs).king_sq,(ulong)local_dc);
  (this->ifo).ks[local_dc] = *pvVar5;
  local_e0 = local_dc ^ black;
  bVar1 = is_attacked(this,(this->ifo).ks + local_dc,&local_dc,&local_e0,0);
  (this->ifo).incheck = bVar1;
  bVar1 = in_check(this);
  if (bVar1) {
    local_e4 = local_dc ^ black;
    local_190 = attackers_of2(this,(this->ifo).ks + local_dc,&local_e4);
  }
  else {
    local_190 = 0;
  }
  (this->ifo).checkers = local_190;
  UVar3 = pinned(this,local_dc);
  (this->ifo).pinned[local_dc] = UVar3;
  UVar3 = pinned(this,local_dc ^ black);
  (this->ifo).pinned[(int)(local_dc ^ black)] = UVar3;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void position::setup(std::istringstream& fen) {
	clear();

	std::string token;
	fen >> token;
	Square s = Square::A8;

	for (auto& c : token) {
		if (isdigit(c)) s += int(c - '0');
		else if (c == '/') s -= 16;
		else { set_piece(c, s); ++s; }
	}

	// side to move
	fen >> token;
	ifo.stm = (token == "w" ? Color::white : Color::black);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	// the castle rights
	fen >> token;
	ifo.cmask = U16(0);
	for (auto& c : token) {
		U16 cr = CastleRights.at(c);
		ifo.cmask |= cr;
		ifo.key ^= zobrist::castle(ifo.stm, cr);
		ifo.repkey ^= zobrist::castle(ifo.stm, cr);
	}


	// ep square
	fen >> token;
	ifo.eps = Square::no_square;
	Row row = Row::no_row; Col col = Col::no_col;
	for (auto& c : token) {
		if (c >= 'a' && c <= 'h') col = Col(c - 'a');
		if (c == '3' || c == '6') row = Row(c - '1');
	}
	ifo.eps = Square(8 * row + col);

	if (!util::on_board(ifo.eps)) ifo.eps = Square::no_square;

	if (ifo.eps != Square::no_square) {
		ifo.key ^= zobrist::ep(util::col(ifo.eps));
		ifo.repkey ^= zobrist::ep(util::col(ifo.eps));
	}

	// half-moves since last pawn move/capture
	fen >> token;

	ifo.move50 = (token != "-" ? U8(std::stoi(token)) : 0);

	ifo.key ^= zobrist::mv50(ifo.move50);

	// move counter
	fen >> token;
	ifo.hmvs = (token != "-" ? U16(std::stoi(token)) : 0);
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// check info
	Color stm = to_move();
	ifo.ks[stm] = pcs.king_sq[stm];
	ifo.incheck = is_attacked(ifo.ks[stm], stm, Color(stm ^ 1));

	ifo.checkers = (in_check() ? attackers_of2(ifo.ks[stm], Color(stm ^ 1)) : 0ULL);
	ifo.pinned[stm] = pinned(stm);
	ifo.pinned[stm ^ 1] = pinned(Color(stm ^ 1));
}